

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeferredTypeHandler.cpp
# Opt level: O3

ES5ArrayTypeHandler * __thiscall
Js::DeferredTypeHandlerBase::ConvertToES5ArrayType
          (DeferredTypeHandlerBase *this,DynamicObject *instance,int initSlotCapacity)

{
  int *piVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ES5ArrayTypeHandlerBase<unsigned_short> *pEVar5;
  
  if (0xfffe < initSlotCapacity) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DeferredTypeHandler.cpp"
                                ,0xac,
                                "(initSlotCapacity <= ES5ArrayTypeHandler::MaxPropertyIndexSize)",
                                "initSlotCapacity <= ES5ArrayTypeHandler::MaxPropertyIndexSize");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pEVar5 = ConvertToTypeHandler<Js::ES5ArrayTypeHandlerBase<unsigned_short>>
                     (this,instance,initSlotCapacity,0);
  piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr)->convertDeferredToDictionaryCount;
  *piVar1 = *piVar1 + 1;
  return pEVar5;
}

Assistant:

ES5ArrayTypeHandler* DeferredTypeHandlerBase::ConvertToES5ArrayType(DynamicObject* instance, int initSlotCapacity)
    {
        // DeferredTypeHandler is only used internally by the type system. "initSlotCapacity" should be a tiny number.
        Assert(initSlotCapacity <= ES5ArrayTypeHandler::MaxPropertyIndexSize);

        ES5ArrayTypeHandler* newTypeHandler = ConvertToTypeHandler<ES5ArrayTypeHandler>(instance, initSlotCapacity);

    #ifdef PROFILE_TYPES
        instance->GetScriptContext()->convertDeferredToDictionaryCount++;
    #endif
        return newTypeHandler;
    }